

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.h
# Opt level: O0

void mempool_free_spare_slab(mempool *pool)

{
  mslab *pmVar1;
  rlist *prVar2;
  mempool *pool_local;
  
  if (pool->spare != (mslab *)0x0) {
    pmVar1 = pool->spare;
    prVar2 = &(pmVar1->slab).next_in_list;
    prVar2->prev->next = (pmVar1->slab).next_in_list.next;
    ((pmVar1->slab).next_in_list.next)->prev = prVar2->prev;
    (pmVar1->slab).next_in_list.next = prVar2;
    prVar2->prev = prVar2;
    (pool->slabs).stats.total = (pool->slabs).stats.total - (pool->spare->slab).size;
    slab_put_with_order(pool->cache,&pool->spare->slab);
    pool->spare = (mslab *)0x0;
    return;
  }
  __assert_fail("pool->spare != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                ,0x14f,"void mempool_free_spare_slab(struct mempool *)");
}

Assistant:

static inline void
mempool_free_spare_slab(struct mempool *pool)
{
	assert(pool->spare != NULL);
	slab_list_del(&pool->slabs, &pool->spare->slab, next_in_list);
	slab_put_with_order(pool->cache, &pool->spare->slab);
	pool->spare = NULL;
}